

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhInstallCell(lhcell *pCell)

{
  sxu32 sVar1;
  lhpage *plVar2;
  uint uVar3;
  lhcell **pplVar4;
  uint local_4c;
  sxu32 n;
  lhcell **apNew;
  lhcell *pEntry;
  sxu32 nNewSize;
  lhcell **apTable;
  sxu32 nTableSize;
  sxu32 iBucket;
  lhpage *pPage;
  lhcell *pCell_local;
  
  plVar2 = pCell->pPage->pMaster;
  if (plVar2->nCell == 0) {
    pplVar4 = (lhcell **)SyMemBackendAlloc(&plVar2->pHash->sAllocator,0x100);
    if (pplVar4 == (lhcell **)0x0) {
      return -1;
    }
    SyZero(pplVar4,0x100);
    plVar2->apCell = pplVar4;
    plVar2->nCellSize = 0x20;
  }
  uVar3 = pCell->nHash & plVar2->nCellSize - 1;
  pCell->pNextCol = plVar2->apCell[uVar3];
  if (plVar2->apCell[uVar3] != (lhcell *)0x0) {
    plVar2->apCell[uVar3]->pPrevCol = pCell;
  }
  plVar2->apCell[uVar3] = pCell;
  if (plVar2->pFirst == (lhcell *)0x0) {
    plVar2->pList = pCell;
    plVar2->pFirst = pCell;
  }
  else if (plVar2->pList == (lhcell *)0x0) {
    plVar2->pList = pCell;
  }
  else {
    pCell->pNext = plVar2->pList;
    plVar2->pList->pPrev = pCell;
    plVar2->pList = pCell;
  }
  plVar2->nCell = plVar2->nCell + 1;
  if ((plVar2->nCellSize * 3 <= plVar2->nCell) && (plVar2->nCell < 100000)) {
    sVar1 = plVar2->nCellSize;
    pplVar4 = (lhcell **)SyMemBackendAlloc(&plVar2->pHash->sAllocator,sVar1 << 4);
    if (pplVar4 != (lhcell **)0x0) {
      SyZero(pplVar4,sVar1 << 4);
      local_4c = 0;
      apNew = (lhcell **)plVar2->pList;
      for (; local_4c < plVar2->nCell; local_4c = local_4c + 1) {
        apNew[0xf] = (lhcell *)0x0;
        apNew[0xe] = (lhcell *)0x0;
        uVar3 = *(uint *)apNew & sVar1 * 2 - 1;
        apNew[0xe] = pplVar4[uVar3];
        if (pplVar4[uVar3] != (lhcell *)0x0) {
          pplVar4[uVar3]->pPrevCol = (lhcell *)apNew;
        }
        pplVar4[uVar3] = (lhcell *)apNew;
        apNew = (lhcell **)apNew[0xc];
      }
      SyMemBackendFree(&plVar2->pHash->sAllocator,plVar2->apCell);
      plVar2->apCell = pplVar4;
      plVar2->nCellSize = sVar1 * 2;
    }
  }
  return 0;
}

Assistant:

static int lhInstallCell(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;
	sxu32 iBucket;
	if( pPage->nCell < 1 ){
		sxu32 nTableSize = 32; /* Must be a power of two */
		lhcell **apTable;
		/* Allocate a new cell table */
		apTable = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nTableSize * sizeof(lhcell *));
		if( apTable == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Zero the new table */
		SyZero((void *)apTable, nTableSize * sizeof(lhcell *));
		/* Install it */
		pPage->apCell = apTable;
		pPage->nCellSize = nTableSize;
	}
	iBucket = pCell->nHash & (pPage->nCellSize - 1);
	pCell->pNextCol = pPage->apCell[iBucket];
	if( pPage->apCell[iBucket] ){
		pPage->apCell[iBucket]->pPrevCol = pCell;
	}
	pPage->apCell[iBucket] = pCell;
	if( pPage->pFirst == 0 ){
		pPage->pFirst = pPage->pList = pCell;
	}else{
		MACRO_LD_PUSH(pPage->pList,pCell);
	}
	pPage->nCell++;
	if( (pPage->nCell >= pPage->nCellSize * 3) && pPage->nCell < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pPage->nCellSize << 1;
		lhcell *pEntry;
		lhcell **apNew;
		sxu32 n;
		
		apNew = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nNewSize * sizeof(lhcell *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(lhcell *));
			/* Rehash all entries */
			n = 0;
			pEntry = pPage->pList;
			for(;;){
				/* Loop one */
				if( n >= pPage->nCell ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->nHash & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pPage->pHash->sAllocator,(void *)pPage->apCell);
			pPage->apCell = apNew;
			pPage->nCellSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}